

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactQuantizedBvh.h
# Opt level: O2

void __thiscall
cbtQuantizedBvhTree::getNodeBound(cbtQuantizedBvhTree *this,int nodeindex,cbtAABB *bound)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar5 [56];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined8 in_XMM1_Qb;
  cbtVector3 cVar6;
  
  auVar5 = in_ZMM0._8_56_;
  cVar6 = bt_unquantize((this->m_node_array).super_cbtAlignedObjectArray<BT_QUANTIZED_BVH_NODE>.
                        m_data[nodeindex].m_quantizedAabbMin,&(this->m_global_bound).m_min,
                        &this->m_bvhQuantization);
  auVar3._0_8_ = cVar6.m_floats._0_8_;
  auVar3._8_56_ = auVar5;
  auVar1._8_8_ = in_XMM1_Qb;
  auVar1._0_8_ = cVar6.m_floats._8_8_;
  auVar1 = vmovlhps_avx(auVar3._0_16_,auVar1);
  auVar5 = ZEXT856(auVar1._8_8_);
  *(undefined1 (*) [16])(bound->m_min).m_floats = auVar1;
  cVar6 = bt_unquantize((this->m_node_array).super_cbtAlignedObjectArray<BT_QUANTIZED_BVH_NODE>.
                        m_data[nodeindex].m_quantizedAabbMax,&(this->m_global_bound).m_min,
                        &this->m_bvhQuantization);
  auVar4._0_8_ = cVar6.m_floats._0_8_;
  auVar4._8_56_ = auVar5;
  auVar2._8_8_ = in_XMM1_Qb;
  auVar2._0_8_ = cVar6.m_floats._8_8_;
  auVar1 = vmovlhps_avx(auVar4._0_16_,auVar2);
  *(undefined1 (*) [16])(bound->m_max).m_floats = auVar1;
  return;
}

Assistant:

SIMD_FORCE_INLINE void getNodeBound(int nodeindex, cbtAABB& bound) const
	{
		bound.m_min = bt_unquantize(
			m_node_array[nodeindex].m_quantizedAabbMin,
			m_global_bound.m_min, m_bvhQuantization);

		bound.m_max = bt_unquantize(
			m_node_array[nodeindex].m_quantizedAabbMax,
			m_global_bound.m_min, m_bvhQuantization);
	}